

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void __thiscall QList<QCss::Symbol>::reserve(QList<QCss::Symbol> *this,qsizetype asize)

{
  ArrayOptions *pAVar1;
  Data *pDVar2;
  long lVar3;
  Symbol *pSVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayDataPointer<QCss::Symbol> local_48;
  QArrayData *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar2 = (this->d).d;
  if ((pDVar2 != (Data *)0x0) &&
     (asize <= ((long)((long)(this->d).ptr -
                      ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
               >> 3) * 0x3333333333333333 + (pDVar2->super_QArrayData).alloc)) {
    if (((pDVar2->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
         super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) != 0) goto LAB_005f3239;
    if ((pDVar2 != (Data *)0x0) &&
       ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 1)) {
      pAVar1 = &(pDVar2->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      goto LAB_005f3239;
    }
  }
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (Symbol *)&DAT_aaaaaaaaaaaaaaaa;
  lVar3 = (this->d).size;
  if (asize < lVar3) {
    asize = lVar3;
  }
  local_28 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (Symbol *)QArrayData::allocate(&local_28,0x28,0x10,asize,KeepSize);
  local_48.d = (Data *)local_28;
  local_48.size = 0;
  pSVar4 = (this->d).ptr;
  QtPrivate::QGenericArrayOps<QCss::Symbol>::copyAppend
            ((QGenericArrayOps<QCss::Symbol> *)&local_48,pSVar4,pSVar4 + (this->d).size);
  if (&(local_48.d)->super_QArrayData != (QArrayData *)0x0) {
    *(byte *)&(((ArrayOptions *)((long)local_48.d + 4))->
              super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(((ArrayOptions *)((long)local_48.d + 4))->
               super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  pDVar2 = (this->d).d;
  pSVar4 = (this->d).ptr;
  (this->d).d = local_48.d;
  (this->d).ptr = local_48.ptr;
  qVar5 = (this->d).size;
  (this->d).size = local_48.size;
  local_48.d = pDVar2;
  local_48.ptr = pSVar4;
  local_48.size = qVar5;
  QArrayDataPointer<QCss::Symbol>::~QArrayDataPointer(&local_48);
LAB_005f3239:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}